

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O0

vector<CBlockHeader,_std::allocator<CBlockHeader>_> * __thiscall
HeadersSyncState::PopHeadersReadyForAcceptance(HeadersSyncState *this)

{
  long lVar1;
  size_type sVar2;
  long in_RSI;
  CBlockHeader *in_RDI;
  long in_FS_OFFSET;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *ret;
  deque<CompressedHeader,_std::allocator<CompressedHeader>_> *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  byte in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar3;
  CBlockHeader *this_00;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_ffffffffffffff28);
  inline_assertion_check<false,bool>
            ((bool *)this_00,(char *)in_RDI,
             CONCAT13(in_stack_ffffffffffffff3f,
                      CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)),
             in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  if (*(int *)(in_RSI + 0x1e4) == 1) {
    while( true ) {
      sVar2 = std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::size
                        (in_stack_ffffffffffffff28);
      bVar3 = 1;
      if (sVar2 < 0x391e) {
        sVar2 = std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::size
                          (in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff3e = 0;
        bVar3 = in_stack_ffffffffffffff3e;
        if (sVar2 != 0) {
          in_stack_ffffffffffffff3e = *(byte *)(in_RSI + 0x1e0);
          bVar3 = in_stack_ffffffffffffff3e;
        }
      }
      if ((bVar3 & 1) == 0) break;
      std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::front
                ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
                 CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff3e,
                                         CONCAT24(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38))));
      CompressedHeader::GetFullHeader((CompressedHeader *)this_00,(uint256 *)in_RDI);
      std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::emplace_back<CBlockHeader>
                ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)this_00,in_RDI);
      std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::pop_front
                (in_stack_ffffffffffffff28);
      std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::back
                ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_ffffffffffffff28);
      CBlockHeader::GetHash(this_00);
      *(undefined8 *)(in_RSI + 0x1a0) = local_78;
      *(undefined8 *)(in_RSI + 0x1a8) = local_70;
      *(undefined8 *)(in_RSI + 0x1b0) = local_68;
      *(undefined8 *)(in_RSI + 0x1b8) = local_60;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CBlockHeader> HeadersSyncState::PopHeadersReadyForAcceptance()
{
    std::vector<CBlockHeader> ret;

    Assume(m_download_state == State::REDOWNLOAD);
    if (m_download_state != State::REDOWNLOAD) return ret;

    while (m_redownloaded_headers.size() > REDOWNLOAD_BUFFER_SIZE ||
            (m_redownloaded_headers.size() > 0 && m_process_all_remaining_headers)) {
        ret.emplace_back(m_redownloaded_headers.front().GetFullHeader(m_redownload_buffer_first_prev_hash));
        m_redownloaded_headers.pop_front();
        m_redownload_buffer_first_prev_hash = ret.back().GetHash();
    }
    return ret;
}